

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O2

void demo_flush_init_cmd(demo *demo)

{
  VkResult VVar1;
  VkCommandBuffer cmd_bufs [1];
  VkSubmitInfo submit_info;
  
  if (demo->setup_cmd != (VkCommandBuffer)0x0) {
    VVar1 = (*glad_vkEndCommandBuffer)(demo->setup_cmd);
    if (VVar1 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,299,"void demo_flush_init_cmd(struct demo *)");
    }
    cmd_bufs[0] = demo->setup_cmd;
    submit_info.pCommandBuffers = cmd_bufs;
    submit_info.pNext = (void *)0x0;
    submit_info.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submit_info.signalSemaphoreCount = 0;
    submit_info._60_4_ = 0;
    submit_info.waitSemaphoreCount = 0;
    submit_info._20_4_ = 0;
    submit_info.pWaitSemaphores = (VkSemaphore *)0x0;
    submit_info.pSignalSemaphores = (VkSemaphore *)0x0;
    submit_info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submit_info._4_4_ = 0;
    submit_info.commandBufferCount = 1;
    submit_info._44_4_ = 0;
    VVar1 = (*glad_vkQueueSubmit)(demo->queue,1,&submit_info,(VkFence)0x0);
    if (VVar1 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x13a,"void demo_flush_init_cmd(struct demo *)");
    }
    VVar1 = (*glad_vkQueueWaitIdle)(demo->queue);
    if (VVar1 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                    ,0x13d,"void demo_flush_init_cmd(struct demo *)");
    }
    (*glad_vkFreeCommandBuffers)(demo->device,demo->cmd_pool,1,cmd_bufs);
    demo->setup_cmd = (VkCommandBuffer)0x0;
  }
  return;
}

Assistant:

static void demo_flush_init_cmd(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    if (demo->setup_cmd == VK_NULL_HANDLE)
        return;

    err = vkEndCommandBuffer(demo->setup_cmd);
    assert(!err);

    const VkCommandBuffer cmd_bufs[] = {demo->setup_cmd};
    VkFence nullFence = {VK_NULL_HANDLE};
    VkSubmitInfo submit_info = {.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
                                .pNext = NULL,
                                .waitSemaphoreCount = 0,
                                .pWaitSemaphores = NULL,
                                .pWaitDstStageMask = NULL,
                                .commandBufferCount = 1,
                                .pCommandBuffers = cmd_bufs,
                                .signalSemaphoreCount = 0,
                                .pSignalSemaphores = NULL};

    err = vkQueueSubmit(demo->queue, 1, &submit_info, nullFence);
    assert(!err);

    err = vkQueueWaitIdle(demo->queue);
    assert(!err);

    vkFreeCommandBuffers(demo->device, demo->cmd_pool, 1, cmd_bufs);
    demo->setup_cmd = VK_NULL_HANDLE;
}